

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

Bool HasMixedContent(Node *element)

{
  Bool BVar1;
  Node *local_20;
  Node *node;
  Node *element_local;
  
  if (element != (Node *)0x0) {
    for (local_20 = element->content; local_20 != (Node *)0x0; local_20 = local_20->next) {
      BVar1 = prvTidynodeIsText(local_20);
      if (BVar1 != no) {
        return yes;
      }
    }
  }
  return no;
}

Assistant:

static Bool HasMixedContent (Node *element)
{
    Node * node;

    if (!element)
        return no;

    for (node = element->content; node; node = node->next)
        if ( TY_(nodeIsText)(node) )
             return yes;

    return no;
}